

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O0

void __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::enqueue
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          *clients,unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                   *client,milliseconds collect_time)

{
  size_t sVar1;
  type *ptVar2;
  null_logger_t *pnVar3;
  duration<long,_std::ratio<1L,_1000L>_> *pdVar4;
  duration<long,_std::ratio<1L,_1000L>_> *in_RSI;
  long in_RDI;
  size_t expected;
  size_t in_stack_00000218;
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  *in_stack_00000220;
  weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  *in_stack_00000228;
  milliseconds in_stack_00000230;
  enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  *in_stack_fffffffffffffde8;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  type *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  int local_ac;
  duration<long,std::ratio<1l,1000l>> local_a8 [8];
  rep local_a0;
  type *local_78 [2];
  duration<long,_std::ratio<1L,_1000L>_> *local_68;
  undefined4 local_4c;
  undefined8 local_48;
  type **local_40;
  duration<long,_std::ratio<1L,_1000L>_> *local_38;
  bool local_29;
  undefined8 local_28;
  memory_order local_20;
  undefined4 local_1c;
  undefined8 local_18;
  type **local_10;
  duration<long,_std::ratio<1L,_1000L>_> *local_8;
  
  local_68 = in_RSI;
  sVar1 = detail::
          client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
          ::enqueue(in_stack_fffffffffffffe08,
                    (unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>
                     *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  if (sVar1 == 1) {
    local_78[0] = (type *)0x0;
    pdVar4 = local_68 + 0x9d;
    local_48 = 1;
    local_4c = 5;
    local_40 = local_78;
    local_38 = pdVar4;
    local_20 = std::__cmpexch_failure_order
                         ((memory_order)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    local_18 = 1;
    local_1c = 5;
    local_28 = 1;
    switch(0x2edac4) {
    default:
      if (local_20 - consume < 2) {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      else if (local_20 == seq_cst) {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      else {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      break;
    case 2:
      if (local_20 - consume < 2) {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      else if (local_20 == seq_cst) {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      else {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      break;
    case 3:
      if (local_20 - consume < 2) {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      else if (local_20 == seq_cst) {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      else {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      break;
    case 4:
      if (local_20 - consume < 2) {
        LOCK();
        in_stack_fffffffffffffe18 = (type *)pdVar4->__r;
        in_stack_fffffffffffffe17 = local_78[0] == in_stack_fffffffffffffe18;
        if ((bool)in_stack_fffffffffffffe17) {
          pdVar4->__r = 1;
          in_stack_fffffffffffffe18 = local_78[0];
        }
        UNLOCK();
        local_29 = (bool)in_stack_fffffffffffffe17;
        if (!(bool)in_stack_fffffffffffffe17) {
          local_78[0] = in_stack_fffffffffffffe18;
        }
      }
      else if (local_20 == seq_cst) {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        local_29 = local_78[0] == ptVar2;
        if (local_29) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        if (!local_29) {
          local_78[0] = ptVar2;
        }
      }
      else {
        LOCK();
        ptVar2 = (type *)pdVar4->__r;
        in_stack_fffffffffffffe27 = local_78[0] == ptVar2;
        if ((bool)in_stack_fffffffffffffe27) {
          pdVar4->__r = 1;
          ptVar2 = local_78[0];
        }
        UNLOCK();
        local_29 = (bool)in_stack_fffffffffffffe27;
        if (!(bool)in_stack_fffffffffffffe27) {
          local_78[0] = ptVar2;
        }
      }
    }
    if (local_29 != false) {
      local_10 = local_78;
      local_8 = pdVar4;
      pnVar3 = cinatra::null_logger_t::operator<<
                         ((null_logger_t *)&cinatra::NULL_LOGGER,
                          (char (*) [47])"start timeout client collecter of client_pool{");
      pnVar3 = cinatra::null_logger_t::operator<<
                         (pnVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(in_RDI + 0xa08));
      cinatra::null_logger_t::operator<<(pnVar3,(char (*) [2])0x357c37);
      std::
      enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
      ::weak_from_this(in_stack_fffffffffffffde8);
      local_ac = 0x32;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_a8,&local_ac);
      pdVar4 = std::max<std::chrono::duration<long,std::ratio<1l,1000l>>>
                         (local_68,in_stack_fffffffffffffdf0);
      local_a0 = pdVar4->__r;
      collect_idle_timeout_client
                (in_stack_00000228,in_stack_00000220,in_stack_00000230,in_stack_00000218);
      std::thread::hardware_concurrency();
      get_global_executor<coro_io::io_context_pool>(0);
      async_simple::coro::Lazy<void>::via
                ((Lazy<void> *)in_stack_fffffffffffffe18,
                 (Executor *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      async_simple::coro::detail::LazyBase<void,_true>::
      start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_example____include_cinatra_ylt_coro_io_client_pool_hpp:262:20)>
                ((LazyBase<void,_true> *)
                 CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18);
      async_simple::coro::RescheduleLazy<void>::~RescheduleLazy((RescheduleLazy<void> *)0x2ee1a2);
      async_simple::coro::Lazy<void>::~Lazy((Lazy<void> *)0x2ee1af);
      std::weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>::
      ~weak_ptr((weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
                 *)0x2ee1bc);
    }
  }
  return;
}

Assistant:

void enqueue(
      coro_io::detail::client_queue<std::unique_ptr<client_t>>& clients,
      std::unique_ptr<client_t> client,
      std::chrono::milliseconds collect_time) {
    if (clients.enqueue(std::move(client)) == 1) {
      std::size_t expected = 0;
      if (clients.collecter_cnt_.compare_exchange_strong(expected, 1)) {
        CINATRA_LOG_TRACE << "start timeout client collecter of client_pool{"
                          << host_name_ << "}";
        collect_idle_timeout_client(
            this->weak_from_this(), clients,
            (std::max)(collect_time, std::chrono::milliseconds{50}),
            pool_config_.idle_queue_per_max_clear_count)
            .via(coro_io::get_global_executor())
            .start([](auto&&) {
            });
      }
    }
  }